

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O1

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  Tensor *pTVar1;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  int iVar5;
  Tensor *t;
  Tensor *d;
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&this->h,&lp->values);
  pTVar1 = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (d = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start; d != pTVar1; d = d + 1) {
    uVar2 = (ulong)(d->d).nd;
    iVar5 = 1;
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        iVar5 = iVar5 * (d->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    pfVar3 = (float *)(**(code **)(**(long **)(default_device + 0x10) + 0x10))
                                (*(long **)(default_device + 0x10),(ulong)(iVar5 * (d->d).bd) << 2);
    d->v = pfVar3;
    TensorTools::Zero(d);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)default_device->mem->malloc(t.d.size() * sizeof(float));
    TensorTools::Zero(t);
  }
}